

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

void av1_cnn_convolve(float **input,int in_width,int in_height,int in_stride,
                     CNN_LAYER_CONFIG *layer_config,float **output,int out_stride,int start_idx,
                     int step)

{
  PADDING_TYPE PVar1;
  int cstep_00;
  int filter_height_half_00;
  int filter_width_half_00;
  int in_ECX;
  int in_EDX;
  undefined8 unaff_RBX;
  int unaff_EBP;
  int in_ESI;
  float **in_RDI;
  CNN_LAYER_CONFIG *in_R8;
  float **in_R9;
  float **unaff_R12;
  int unaff_R14D;
  int unaff_R15D;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_00000028;
  int jj_shift;
  int ii_shift;
  int channel_step;
  int filter_width_half;
  int filter_height_half;
  int cstep;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int in_stride_00;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffc0;
  
  cstep_00 = in_R8->in_channels * in_R8->out_channels;
  filter_height_half_00 = in_R8->filter_height >> 1;
  filter_width_half_00 = in_R8->filter_width >> 1;
  in_stride_00 = in_stack_00000018;
  if (in_stack_00000018 < 2) {
    in_stride_00 = 1;
  }
  if ((in_R8->maxpool == 0) || ((in_R8->skip_height < 2 && (in_R8->skip_width < 2)))) {
    if ((in_R8->filter_height == 1) && (in_R8->filter_width == 1)) {
      convolve_element_wise
                ((float **)CONCAT44(filter_width_half_00,in_stride_00),in_stack_ffffffffffffff9c,
                 in_stack_ffffffffffffff98,in_stride_00,
                 (CNN_LAYER_CONFIG *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                 (float **)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),(int)in_R9,
                 (int)in_R8,in_stack_ffffffffffffffc0);
    }
    else {
      PVar1 = in_R8->pad;
      if (PVar1 == '\0') {
        convolve_no_maxpool_padding_zero
                  (unaff_R12,(int)((ulong)unaff_RBX >> 0x20),(int)unaff_RBX,
                   (int)((ulong)in_RDI >> 0x20),(CNN_LAYER_CONFIG *)CONCAT44(in_ESI,in_EDX),
                   (float **)CONCAT44(in_ECX,in_stack_ffffffffffffffc0),unaff_R15D,unaff_EBP,
                   unaff_retaddr,in_stack_00000008,in_stack_00000010,in_stack_00000018,
                   in_stack_00000020,in_stack_00000028);
      }
      else if (PVar1 == '\x01') {
        convolve_no_maxpool_padding_replicate
                  ((float **)CONCAT44(in_ECX,in_stack_ffffffffffffffc0),(int)((ulong)in_R8 >> 0x20),
                   (int)in_R8,(int)((ulong)in_R9 >> 0x20),
                   (CNN_LAYER_CONFIG *)CONCAT44(cstep_00,filter_height_half_00),
                   (float **)CONCAT44(filter_width_half_00,in_stride_00),(int)in_RDI,(int)unaff_RBX,
                   (int)unaff_R12,unaff_R14D,unaff_R15D,unaff_EBP);
      }
      else if (PVar1 == '\x02') {
        (*av1_cnn_convolve_no_maxpool_padding_valid)
                  (in_RDI,in_ESI,in_EDX,in_ECX,in_R8,in_R9,in_stack_00000008,in_stack_00000010,
                   cstep_00,in_stride_00);
      }
    }
  }
  else {
    PVar1 = in_R8->pad;
    if (PVar1 == '\0') {
      convolve_maxpool_padding_zero
                (in_RDI,in_ESI,in_EDX,in_ECX,in_R8,in_R9,in_stack_00000008,cstep_00,
                 filter_width_half_00,filter_height_half_00);
    }
    else if (PVar1 == '\x01') {
      convolve_maxpool_padding_replicate
                (in_RDI,in_ESI,in_EDX,in_ECX,in_R8,in_R9,in_stack_00000008,cstep_00,
                 filter_width_half_00,filter_height_half_00);
    }
    else if (PVar1 == '\x02') {
      convolve_maxpool_padding_valid
                (in_RDI,in_ESI,in_EDX,in_ECX,in_R8,in_R9,in_stack_00000008,cstep_00);
    }
  }
  return;
}

Assistant:

static void av1_cnn_convolve(const float **input, int in_width, int in_height,
                             int in_stride,
                             const CNN_LAYER_CONFIG *layer_config,
                             float **output, int out_stride, int start_idx,
                             int step) {
  assert(!layer_config->deconvolve);
  const int cstep = layer_config->in_channels * layer_config->out_channels;
  const int filter_height_half = layer_config->filter_height >> 1;
  const int filter_width_half = layer_config->filter_width >> 1;
  const int channel_step = AOMMAX(step, 1);

  if (layer_config->maxpool &&
      (layer_config->skip_height > 1 || layer_config->skip_width > 1)) {
    switch (layer_config->pad) {
      case PADDING_SAME_ZERO:
        convolve_maxpool_padding_zero(input, in_width, in_height, in_stride,
                                      layer_config, output, out_stride, cstep,
                                      filter_width_half, filter_height_half);
        break;
      case PADDING_SAME_REPLICATE:
        convolve_maxpool_padding_replicate(
            input, in_width, in_height, in_stride, layer_config, output,
            out_stride, cstep, filter_width_half, filter_height_half);
        break;
      case PADDING_VALID:
        convolve_maxpool_padding_valid(input, in_width, in_height, in_stride,
                                       layer_config, output, out_stride, cstep);
        break;
      default: assert(0 && "Unknown padding type");
    }
  } else {
    // Results in element-wise matrix multiplication.
    if (layer_config->filter_height == 1 && layer_config->filter_width == 1) {
      convolve_element_wise(input, in_width, in_height, in_stride, layer_config,
                            output, out_stride, start_idx, step);
      return;
    }
    const int ii_shift =
        filter_height_half - (layer_config->filter_height - 1) % 2;
    const int jj_shift =
        filter_width_half - (layer_config->filter_width - 1) % 2;
    switch (layer_config->pad) {
      case PADDING_SAME_ZERO:
        convolve_no_maxpool_padding_zero(
            input, in_width, in_height, in_stride, layer_config, output,
            out_stride, start_idx, cstep, filter_width_half, filter_height_half,
            ii_shift, jj_shift, channel_step);
        break;
      case PADDING_SAME_REPLICATE:
        convolve_no_maxpool_padding_replicate(
            input, in_width, in_height, in_stride, layer_config, output,
            out_stride, start_idx, cstep, ii_shift, jj_shift, channel_step);
        break;
      case PADDING_VALID:
        av1_cnn_convolve_no_maxpool_padding_valid(
            input, in_width, in_height, in_stride, layer_config, output,
            out_stride, start_idx, cstep, channel_step);
        break;
      default: assert(0 && "Unknown padding type");
    }
  }
}